

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void tile_worker_hook_init
               (AV1Decoder *pbi,DecWorkerData *thread_data,TileBufferDec *tile_buffer,
               TileDataDec *tile_data,uint8_t allow_update_cdf)

{
  int num_planes;
  AV1_COMMON *cm_00;
  long in_RCX;
  size_t *in_RSI;
  long in_RDI;
  byte in_R8B;
  MACROBLOCKD *xd;
  int tile_col;
  int tile_row;
  ThreadData *td;
  AV1_COMMON *cm;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  aom_internal_error_info *in_stack_ffffffffffffffb0;
  CommonContexts *above_contexts;
  MACROBLOCKD *xd_00;
  undefined4 uVar1;
  int tile_row_00;
  MACROBLOCKD *data;
  
  cm_00 = (AV1_COMMON *)(in_RDI + 0x3b60);
  xd_00 = (MACROBLOCKD *)*in_RSI;
  tile_row_00 = *(int *)(in_RCX + 0x10);
  uVar1 = *(undefined4 *)(in_RCX + 0x14);
  xd_00[0x11].plane[0].seg_iqmatrix[4][0xe] = (qm_val_t *)(in_RCX + 0x18);
  memset(xd_00[1].plane[0].seg_dequant_QTX,0,0x30000);
  data = xd_00;
  av1_tile_init((TileInfo *)in_stack_ffffffffffffffb0,
                (AV1_COMMON *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0,
                0x19ff69);
  xd_00->current_base_qindex = (cm_00->quant_params).base_qindex;
  setup_bool_decoder((MACROBLOCKD *)cm_00,(uint8_t *)data,(uint8_t *)CONCAT44(tile_row_00,uVar1),
                     (size_t)xd_00,in_stack_ffffffffffffffb0,
                     (aom_reader *)CONCAT44(in_stack_ffffffffffffffac,(uint)in_R8B),(uint8_t)in_RCX)
  ;
  av1_init_macroblockd((AV1_COMMON *)CONCAT44(tile_row_00,uVar1),xd_00);
  xd_00->error_info = (aom_internal_error_info *)(in_RSI + 2);
  above_contexts = &cm_00->above_contexts;
  num_planes = av1_num_planes(cm_00);
  av1_init_above_context(above_contexts,num_planes,tile_row_00,xd_00);
  memcpy((void *)(in_RCX + 0x60),cm_00->fc,0x52fc);
  xd_00->tile_ctx = (FRAME_CONTEXT *)(in_RCX + 0x60);
  return;
}

Assistant:

static inline void tile_worker_hook_init(AV1Decoder *const pbi,
                                         DecWorkerData *const thread_data,
                                         const TileBufferDec *const tile_buffer,
                                         TileDataDec *const tile_data,
                                         uint8_t allow_update_cdf) {
  AV1_COMMON *cm = &pbi->common;
  ThreadData *const td = thread_data->td;
  int tile_row = tile_data->tile_info.tile_row;
  int tile_col = tile_data->tile_info.tile_col;

  td->bit_reader = &tile_data->bit_reader;
  av1_zero(td->cb_buffer_base.dqcoeff);

  MACROBLOCKD *const xd = &td->dcb.xd;
  av1_tile_init(&xd->tile, cm, tile_row, tile_col);
  xd->current_base_qindex = cm->quant_params.base_qindex;

  setup_bool_decoder(xd, tile_buffer->data, thread_data->data_end,
                     tile_buffer->size, &thread_data->error_info,
                     td->bit_reader, allow_update_cdf);
#if CONFIG_ACCOUNTING
  if (pbi->acct_enabled) {
    td->bit_reader->accounting = &pbi->accounting;
    td->bit_reader->accounting->last_tell_frac =
        aom_reader_tell_frac(td->bit_reader);
  } else {
    td->bit_reader->accounting = NULL;
  }
#endif
  av1_init_macroblockd(cm, xd);
  xd->error_info = &thread_data->error_info;
  av1_init_above_context(&cm->above_contexts, av1_num_planes(cm), tile_row, xd);

  // Initialise the tile context from the frame context
  tile_data->tctx = *cm->fc;
  xd->tile_ctx = &tile_data->tctx;
#if CONFIG_ACCOUNTING
  if (pbi->acct_enabled) {
    tile_data->bit_reader.accounting->last_tell_frac =
        aom_reader_tell_frac(&tile_data->bit_reader);
  }
#endif
}